

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cc
# Opt level: O3

void __thiscall List::Add(List *this,int x)

{
  Node *pNVar1;
  Node *pNVar2;
  Node *this_00;
  
  pNVar1 = this->_tail->_prev;
  this_00 = (Node *)operator_new(0x18);
  Node::Node(this_00,x);
  if (pNVar1 != (Node *)0x0) {
    pNVar2 = this->_tail;
    this_00->_next = pNVar2;
    this_00->_prev = pNVar1;
    pNVar1->_next = this_00;
    pNVar2->_prev = this_00;
    return;
  }
  printf("assertion [");
  printf("prev != __null");
  printf("] fails (%s:%d - %s) ",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gkthiruvathukal[P]systems-code-examples/c_intro/list.cc"
         ,0x45,"Add");
  printf("nomsg");
  putchar(10);
  exit(1);
}

Assistant:

void List::Add(int x)
{
    Node *prev = _tail->getPrev();
    Node *curr = new Node(x);
    assert(prev != NULL)
    assert(curr != NULL)
    curr->setNext(_tail);
    curr->setPrev(prev);
    prev->setNext(curr);
    _tail->setPrev(curr);
}